

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_decoder.c
# Opt level: O2

lzma_ret alone_decoder_memconfig
                   (void *coder_ptr,uint64_t *memusage,uint64_t *old_memlimit,uint64_t new_memlimit)

{
  *memusage = *(uint64_t *)((long)coder_ptr + 0x68);
  *old_memlimit = *(uint64_t *)((long)coder_ptr + 0x60);
  if (new_memlimit != 0) {
    if (new_memlimit < *(ulong *)((long)coder_ptr + 0x68)) {
      return LZMA_MEMLIMIT_ERROR;
    }
    *(uint64_t *)((long)coder_ptr + 0x60) = new_memlimit;
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
alone_decoder_memconfig(void *coder_ptr, uint64_t *memusage,
		uint64_t *old_memlimit, uint64_t new_memlimit)
{
	lzma_alone_coder *coder = coder_ptr;

	*memusage = coder->memusage;
	*old_memlimit = coder->memlimit;

	if (new_memlimit != 0) {
		if (new_memlimit < coder->memusage)
			return LZMA_MEMLIMIT_ERROR;

		coder->memlimit = new_memlimit;
	}

	return LZMA_OK;
}